

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmHashEntryPLI::CVmHashEntryPLI(CVmHashEntryPLI *this,vm_obj_id_t id)

{
  vm_obj_id_t id_local;
  
  id_local = id;
  CVmHashEntryCS::CVmHashEntryCS(&this->super_CVmHashEntryCS,(char *)&id_local,4,1);
  (this->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CVmHashEntry_00360ce8;
  *(vm_obj_id_t *)&(this->super_CVmHashEntryCS).super_CVmHashEntry.field_0x24 = id_local;
  this->status = PLI_UNINITED;
  return;
}

Assistant:

CVmHashEntryPLI(vm_obj_id_t id)
        : CVmHashEntryCS((char *)&id, sizeof(id), TRUE)
    {
        /* 
         *   remember our object ID for easy access (technically, it's stored
         *   as our key value as well, so this is redundant; but it's
         *   transformed into a block of bytes for the key, so it's easier to
         *   keep a separate copy of the true type) 
         */
        id_ = id;

        /* initialize our status */
        status = PLI_UNINITED;
    }